

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O2

StripCtrlChars * stripctrl_new(BinarySink *bs_out,_Bool permit_cr,wchar_t substitution)

{
  StripCtrlCharsImpl *pSVar1;
  
  pSVar1 = stripctrl_new_common(bs_out,permit_cr,substitution);
  (pSVar1->public).binarysink_[0].write = stripctrl_locale_BinarySink_write;
  (pSVar1->public).binarysink_[0].writefmtv =
       (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
  (pSVar1->public).binarysink_[0].binarysink_ = (pSVar1->public).binarysink_;
  return &pSVar1->public;
}

Assistant:

StripCtrlChars *stripctrl_new(
    BinarySink *bs_out, bool permit_cr, wchar_t substitution)
{
    StripCtrlCharsImpl *scc = stripctrl_new_common(
        bs_out, permit_cr, substitution);
    BinarySink_INIT(&scc->public, stripctrl_locale_BinarySink_write);
    return &scc->public;
}